

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  int aret_1;
  int eret_1;
  char *t_1;
  char *f_1;
  int aret;
  int eret;
  char *t;
  char *f;
  int passes;
  int fails;
  int i;
  
  fails = 0;
  f._0_4_ = 0;
  f._4_4_ = 0;
  for (passes = 0; (uint)passes < 0x3f; passes = passes + 1) {
    t = fragment_tests[passes].wildcard;
    __s = fragment_tests[passes].target;
    uVar1 = fragment_tests[passes].expected_result;
    _aret = __s;
    sVar3 = strlen(__s);
    uVar2 = wc_match_fragment(&t,(char **)&aret,__s + sVar3);
    if (uVar2 == uVar1) {
      f._0_4_ = (uint)f + 1;
    }
    else {
      printf("failed test: /%s/ against /%s/ returned %d not %d\n",fragment_tests[passes].wildcard,
             fragment_tests[passes].target,(ulong)uVar2,(ulong)uVar1);
      f._4_4_ = f._4_4_ + 1;
    }
  }
  for (passes = 0; (uint)passes < 0xd; passes = passes + 1) {
    uVar1 = full_tests[passes].expected_result;
    uVar2 = wc_match(full_tests[passes].wildcard,full_tests[passes].target);
    if (uVar2 == uVar1) {
      f._0_4_ = (uint)f + 1;
    }
    else {
      printf("failed test: /%s/ against /%s/ returned %d not %d\n",full_tests[passes].wildcard,
             full_tests[passes].target,(ulong)uVar2,(ulong)uVar1);
      f._4_4_ = f._4_4_ + 1;
    }
  }
  printf("passed %d, failed %d\n",(ulong)(uint)f,(ulong)f._4_4_);
  return 0;
}

Assistant:

int main(void)
{
    int i;
    int fails, passes;

    fails = passes = 0;

    for (i = 0; i < sizeof(fragment_tests)/sizeof(*fragment_tests); i++) {
        const char *f, *t;
        int eret, aret;
        f = fragment_tests[i].wildcard;
        t = fragment_tests[i].target;
        eret = fragment_tests[i].expected_result;
        aret = wc_match_fragment(&f, &t, t + strlen(t));
        if (aret != eret) {
            printf("failed test: /%s/ against /%s/ returned %d not %d\n",
                   fragment_tests[i].wildcard, fragment_tests[i].target,
                   aret, eret);
            fails++;
        } else
            passes++;
    }

    for (i = 0; i < sizeof(full_tests)/sizeof(*full_tests); i++) {
        const char *f, *t;
        int eret, aret;
        f = full_tests[i].wildcard;
        t = full_tests[i].target;
        eret = full_tests[i].expected_result;
        aret = wc_match(f, t);
        if (aret != eret) {
            printf("failed test: /%s/ against /%s/ returned %d not %d\n",
                   full_tests[i].wildcard, full_tests[i].target,
                   aret, eret);
            fails++;
        } else
            passes++;
    }

    printf("passed %d, failed %d\n", passes, fails);

    return 0;
}